

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

void __thiscall mjs::test_spec_runner::~test_spec_runner(test_spec_runner *this)

{
  test_spec_runner *this_local;
  
  completion::~completion(&this->last_result_);
  interpreter::~interpreter(&this->i_);
  std::shared_ptr<mjs::source_file>::~shared_ptr(&this->source_);
  return;
}

Assistant:

static size_t run(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements) {
#ifdef TEST_SPEC_DEBUG
        std::wcout << "Running test spec for " << statements.extend().file->text() << "\n";
        std::wcout << "Parsed:\n";
        print(std::wcout, statements);
        std::wcout << "Specs:\n";
        for (const auto& s: specs) {
            std::wcout << pos_w << s.position << " " << s.expected.type() << " " << to_string(h, s.expected) << "\n";
        }
        std::wcout << "\n";
#endif
        test_spec_runner tsr{h, specs, statements};
        tsr.i_.eval(statements);
        tsr.check_test_spec_done(statements.extend().end);
#ifdef TEST_SPEC_DEBUG
        std::wcout << "\n";
#endif
        return tsr.index_;
    }